

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

double sulp(U *x,BCinfo *bc)

{
  U u;
  BCinfo *bc_local;
  U *x_local;
  
  if ((bc->scale == 0) || (0x6a < (x->L[1] & 0x7ff00000) >> 0x14)) {
    if ((x->L[1] == 0) && (x->L[0] == 0)) {
      __assert_fail("word0(x) || word1(x)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/dtoa.c"
                    ,0x549,"double sulp(U *, BCinfo *)");
    }
    x_local = (U *)ulp(x);
  }
  else {
    x_local = (U *)0x370000000000000;
  }
  return (double)x_local;
}

Assistant:

static double
sulp(U *x, BCinfo *bc)
{
    U u;

    if (bc->scale && 2*P + 1 > (int)((word0(x) & Exp_mask) >> Exp_shift)) {
        /* rv/2^bc->scale is subnormal */
        word0(&u) = (P+2)*Exp_msk1;
        word1(&u) = 0;
        return u.d;
    }
    else {
        assert(word0(x) || word1(x)); /* x != 0.0 */
        return ulp(x);
    }
}